

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  istream *piVar4;
  undefined1 local_1d8 [64];
  undefined1 local_198 [64];
  string local_158 [32];
  undefined1 local_138 [8];
  Parser par;
  string local_38 [8];
  string id;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_741 + 1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  while( true ) {
    piVar4 = std::operator>>((istream *)&std::cin,local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::string(local_158,local_38);
    Parser::Parser((Parser *)local_138,(string *)local_158);
    std::__cxx11::string::~string(local_158);
    bVar1 = Parser::check((Parser *)local_138);
    if (bVar1) {
      Parser::parse((Parser *)local_138);
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6c3);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6cd);
      Parser::get_address_abi_cxx11_((Parser *)(local_198 + 0x20));
      poVar3 = std::operator<<(poVar3,(string *)(local_198 + 0x20));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)(local_198 + 0x20));
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6e3);
      uVar2 = Parser::get_year((Parser *)local_138);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
      poVar3 = std::operator<<(poVar3,anon_var_dwarf_6f9);
      uVar2 = Parser::get_month((Parser *)local_138);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
      poVar3 = std::operator<<(poVar3,anon_var_dwarf_70f);
      uVar2 = Parser::get_day((Parser *)local_138);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
      poVar3 = std::operator<<(poVar3,anon_var_dwarf_719);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_723);
      Parser::get_sex_abi_cxx11_((Parser *)local_198);
      poVar3 = std::operator<<(poVar3,(string *)local_198);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_198);
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_72d);
      Parser::get_animal_abi_cxx11_((Parser *)(local_1d8 + 0x20));
      poVar3 = std::operator<<(poVar3,(string *)(local_1d8 + 0x20));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)(local_1d8 + 0x20));
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_737);
      Parser::get_star_abi_cxx11_((Parser *)local_1d8);
      poVar3 = std::operator<<(poVar3,(string *)local_1d8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_1d8);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6b9);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_741);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Parser::~Parser((Parser *)local_138);
  }
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    string id;
    cout << "请输入身份证号：" << endl;
    while (cin >> id) {
        Parser par(id);
        if (!par.check()) {
            cout << "身份证号不正确！" << endl;
        } else {
            par.parse();
            cout << "查得个人信息为：" << endl;
            cout << "地    址：" << par.get_address() << endl;
            cout << "出生日期：" << par.get_year() << "年" << par.get_month() << "月" << par.get_day() << "日" << endl;
            cout << "性    别：" << par.get_sex() << endl;
            cout << "属    相：" << par.get_animal() << endl;
            cout << "星    座：" << par.get_star() << endl;
        }
        cout << "\n请输入身份证号：" << endl;
    }
    return 0;
}